

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeIdentifier
          (ParserImpl *this,string *identifier)

{
  TokenType TVar1;
  bool bVar2;
  string_view message;
  string local_90;
  AlphaNum local_70;
  string_view local_40 [3];
  
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_IDENTIFIER) {
LAB_002b0b0e:
    std::__cxx11::string::_M_assign((string *)identifier);
    io::Tokenizer::Next(&this->tokenizer_);
    bVar2 = true;
  }
  else {
    if ((this->allow_field_number_ == false) && (this->allow_unknown_field_ == false)) {
      if ((TVar1 == TYPE_INTEGER) && (this->allow_unknown_extension_ != false)) goto LAB_002b0b0e;
    }
    else if (TVar1 == TYPE_INTEGER) goto LAB_002b0b0e;
    local_40[0] = absl::lts_20250127::NullSafeStringView("Expected identifier, got: ");
    local_70.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_70.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_90,(lts_20250127 *)local_40,&local_70,(AlphaNum *)local_70.piece_._M_len);
    message._M_str = local_90._M_dataplus._M_p;
    message._M_len = local_90._M_string_length;
    ReportError(this,message);
    std::__cxx11::string::~string((string *)&local_90);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ConsumeIdentifier(std::string* identifier) {
    if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    // If allow_field_number_ or allow_unknown_field_ is true, we should able
    // to parse integer identifiers.
    if ((allow_field_number_ || allow_unknown_field_ ||
         allow_unknown_extension_) &&
        LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    ReportError(
        absl::StrCat("Expected identifier, got: ", tokenizer_.current().text));
    return false;
  }